

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

Iterator<int,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
          (Iterator<int,_true,_std::allocator<unsigned_long>_> *this)

{
  pointer puVar1;
  size_t sVar2;
  runtime_error *this_00;
  pointer puVar3;
  View<int,_true,_std::allocator<unsigned_long>_> *pVVar4;
  size_t dimension;
  
  pVVar4 = this->view_;
  if ((pVVar4 == (View<int,_true,_std::allocator<unsigned_long>_> *)0x0) || (this->index_ == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_002295bf:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->index_ = this->index_ - 1;
  View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar4);
  if ((pVVar4->geometry_).isSimple_ == true) {
    this->pointer_ = this->pointer_ + -1;
  }
  else {
    pVVar4 = this->view_;
    if (this->index_ == (pVVar4->geometry_).size_) {
      this->pointer_ = this->pointer_ + -1;
      View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar4);
      if ((pVVar4->geometry_).coordinateOrder_ == LastMajorOrder) {
        puVar3 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *puVar3 = *puVar3 - 1;
      }
      else {
        if (this->view_->data_ == (pointer)0x0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Assertion failed.");
          goto LAB_002295bf;
        }
        puVar3 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + ((this->view_->geometry_).dimension_ - 1);
        *puVar3 = *puVar3 - 1;
      }
    }
    else {
      View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar4);
      if ((pVVar4->geometry_).coordinateOrder_ == LastMajorOrder) {
        puVar3 = (this->coordinates_).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar3) {
          dimension = 0;
          do {
            pVVar4 = this->view_;
            if (puVar3[dimension] != 0) goto LAB_00229586;
            sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape(pVVar4,dimension);
            (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[dimension] = sVar2 - 1;
            sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::strides(this->view_,dimension);
            puVar3 = (this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar1 = (this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            this->pointer_ = this->pointer_ + sVar2 * puVar3[dimension];
            dimension = dimension + 1;
          } while (dimension < (ulong)((long)puVar1 - (long)puVar3 >> 3));
        }
      }
      else {
        if (this->view_->data_ == (pointer)0x0) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Assertion failed.");
          goto LAB_002295bf;
        }
        dimension = (this->view_->geometry_).dimension_;
        do {
          dimension = dimension - 1;
          pVVar4 = this->view_;
          if ((this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start[dimension] != 0) goto LAB_00229586;
          sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::shape(pVVar4,dimension);
          (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[dimension] = sVar2 - 1;
          sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::strides(this->view_,dimension);
          this->pointer_ =
               this->pointer_ +
               sVar2 * (this->coordinates_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[dimension];
        } while (dimension != 0);
      }
    }
  }
LAB_00229459:
  testInvariant(this);
  return this;
LAB_00229586:
  sVar2 = View<int,_true,_std::allocator<unsigned_long>_>::strides(pVVar4,dimension);
  this->pointer_ = this->pointer_ + -sVar2;
  puVar3 = (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + dimension;
  *puVar3 = *puVar3 - 1;
  goto LAB_00229459;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator--()
{
    marray_detail::Assert(MARRAY_NO_DEBUG || (view_ != 0 && index_ > 0));
    --index_;
    if(view_->isSimple()) {
        --pointer_;
    }
    else {
        if(index_ == view_->size()) { 
            // decrement from end iterator
            --pointer_;
            if(view_->coordinateOrder() == LastMajorOrder) {
                --coordinates_[0];
            }
            else { // FirstMajorOrder
                --coordinates_[view_->dimension() - 1];
            }
        }
        else {
            if(view_->coordinateOrder() == LastMajorOrder) {
                for(std::size_t j=0; j<coordinates_.size(); ++j) {
                    if(coordinates_[j] == 0) {
                        coordinates_[j] = view_->shape(j)-1;
                        pointer_ += view_->strides(j) * coordinates_[j];
                    }
                    else {
                        pointer_ -= view_->strides(j);
                        --coordinates_[j];
                        break;
                    }
                }
            }
            else { // FirstMajorOrder
                std::size_t j = view_->dimension() - 1;
                for(;;) {
                    if(coordinates_[j] == 0) {
                        coordinates_[j] = view_->shape(j)-1;
                        pointer_ += view_->strides(j) * coordinates_[j];
                    }
                    else {
                        pointer_ -= view_->strides(j);
                        --coordinates_[j];
                        break;
                    }
                    if(j == 0) {
                        break;
                    }
                    else {
                        --j;
                    }
                }
            }
        }
    }
    testInvariant();
    return *this;
}